

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStrMatParInterface.cpp
# Opt level: O2

TPZBaseMatrix * __thiscall
TPZStrMatParInterface::CreateAssemble
          (TPZStrMatParInterface *this,TPZBaseMatrix *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  long *plVar1;
  TPZBaseMatrix *pTVar2;
  long lVar3;
  TPZAutoPointer<TPZGuiInterface> local_30;
  
  (**(code **)(*(long *)this + 0x58))();
  plVar1 = (long *)__dynamic_cast(this,&typeinfo,&::TPZStructMatrix::typeinfo,0xffffffffffffffff);
  pTVar2 = (TPZBaseMatrix *)(**(code **)(*plVar1 + 0x50))(plVar1);
  if (this->fComputeRhs == true) {
    lVar3 = 1;
    if (1 < rhs->fCol) {
      lVar3 = rhs->fCol;
    }
    (*(rhs->super_TPZSavable)._vptr_TPZSavable[0xe])(rhs,plVar1[10],lVar3);
  }
  local_30 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
  LOCK();
  ((local_30.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_30.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (**(code **)(*(long *)this + 0x48))(this,pTVar2,rhs);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_30);
  (**(code **)(*(long *)this + 0x60))(this,pTVar2);
  return pTVar2;
}

Assistant:

TPZBaseMatrix *TPZStrMatParInterface::CreateAssemble(
    TPZBaseMatrix &rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    this->InitCreateAssemble();

    TPZStructMatrix *myself = dynamic_cast<TPZStructMatrix*>(this);
    TPZBaseMatrix *stiff = myself->Create();
    
    const int64_t cols = MAX(1, rhs.Cols());
    if(ComputeRhs()) rhs.Redim(myself->EquationFilter().NEqExpand(), cols);
    Assemble(*stiff, rhs, guiInterface);
    this->EndCreateAssemble(stiff);
#ifdef PZ_LOG2
    if (loggerel.isDebugEnabled()) {
        std::stringstream sout;
        stiff->Print("Stiffness matrix", sout);
        rhs.Print("Right hand side", sout);
        LOGPZ_DEBUG(loggerel, sout.str())
    }
#endif
    return stiff;
}